

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  CapTableBuilder *capTable;
  PointerBuilder other;
  StructBuilder other_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ElementSize size_00;
  unsigned_short data;
  unsigned_short pointers;
  WordCountN<29> WVar4;
  ElementCountN<29> EVar5;
  BitsPerElementTableType BVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  unsigned_long uVar7;
  word *pwVar8;
  uint *puVar9;
  undefined7 extraout_var_02;
  ptrdiff_t pVar10;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  BuilderArena *pBVar11;
  OrphanBuilder *pOVar12;
  undefined7 extraout_var_05;
  word *pwVar13;
  undefined7 extraout_var_06;
  undefined7 extraout_var_07;
  undefined7 extraout_var_08;
  WordCount64 WVar14;
  ByteCount64 BVar15;
  uchar *a;
  undefined7 extraout_var_09;
  undefined7 extraout_var_10;
  undefined7 extraout_var_11;
  undefined7 uVar16;
  WordCountN<29> local_378;
  WordCount64 words;
  ListBuilder newList_2;
  OrphanBuilder replacement_2;
  byte *oldEndByte;
  byte *newEndByte;
  byte *begin;
  word *oldEndWord_2;
  word *newEndWord_2;
  uint MAX_STEP_BYTES;
  BitsPerElementTableType step;
  ElementCountN<29> oldSize_2;
  CapTableBuilder *pCStack_2e8;
  WirePointer *local_2e0;
  PointerBuilder local_2d8;
  uint local_2bc;
  Iterator local_2b8;
  uint i_2;
  Iterator __end6_1;
  Iterator __begin6_1;
  Range<unsigned_int> *__range6_1;
  WirePointer *oldPointers;
  ListBuilder newList_1;
  OrphanBuilder replacement_1;
  WirePointer *element_1;
  word *oldEndWord_1;
  word *newEndWord_1;
  ElementCountN<29> oldSize_1;
  uint POINTERS_PER_ELEMENT;
  CapTableBuilder *pCStack_228;
  void *local_220;
  WirePointer *pWStack_218;
  StructDataBitCount local_210;
  StructPointerCount SStack_20c;
  undefined2 uStack_20a;
  StructBuilder local_208;
  void *local_1e0;
  word *element;
  Iterator local_1d0;
  uint i_1;
  Iterator __end6;
  Iterator __begin6;
  Range<unsigned_int> *__range6;
  undefined1 local_1b0 [8];
  ListBuilder newList;
  undefined1 local_180 [8];
  OrphanBuilder replacement;
  Fault f_2;
  undefined1 local_150 [8];
  DebugComparison<capnp::word_*&,_capnp::word_*&> _kjCondition_2;
  word *expectedEnd;
  Iterator local_118;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_int> *__range4;
  word *oldEndWord;
  word *newEndWord;
  undefined4 local_e8;
  anon_class_1_0_00000001 local_e1;
  SegmentWordCount oldSizeWords;
  ListElementCount local_dc;
  SegmentWordCount sizeWords;
  ListElementCount oldSize;
  uint elementStep;
  StructSize structSize;
  Fault f_1;
  Kind local_c0;
  DebugExpression<capnp::_::WirePointer::Kind> local_bc;
  undefined1 local_b8 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_1;
  WirePointer *tag;
  anon_class_1_0_00000001 local_85;
  WordCountN<29> oldWordCount;
  ElementSize elementSize;
  Fault local_78;
  Fault f;
  Kind local_68;
  DebugExpression<capnp::_::WirePointer::Kind> local_64;
  undefined1 local_60 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  word *target;
  SegmentBuilder *segment;
  WirePointer *ref;
  byte local_1d;
  ListElementCount size;
  bool isText_local;
  OrphanBuilder *pOStack_18;
  ElementCount uncheckedSize_local;
  OrphanBuilder *this_local;
  
  size = (ListElementCount)__file;
  local_1d = (byte)__length & 1;
  pOStack_18 = this;
  ref._4_4_ = assertMaxBits<29u,unsigned_int,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__0>
                        (size,(anon_class_1_0_00000001 *)((long)&ref + 3));
  segment = (SegmentBuilder *)tagAsPtr(this);
  target = (word *)this->segment;
  _kjCondition._24_8_ =
       WireHelpers::followFars((WirePointer **)&segment,this->location,(SegmentBuilder **)&target);
  bVar3 = WirePointer::isNull((WirePointer *)segment);
  if (bVar3) {
    this_local._7_1_ = ref._4_4_ == 0;
    uVar16 = extraout_var;
  }
  else {
    local_68 = WirePointer::kind((WirePointer *)segment);
    local_64 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_68);
    f.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_60
               ,&local_64,(Kind *)((long)&f.exception + 4));
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (bVar3) {
      if ((local_1d & 1) != 0) {
        ref._4_4_ = assertMaxBits<29u,unsigned_int,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__1>
                              (ref._4_4_ + 1,&local_85);
      }
      size_00 = WirePointer::ListRef::elementSize
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
      if (size_00 == INLINE_COMPOSITE) {
        WVar4 = WirePointer::ListRef::inlineCompositeWordCount
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        uVar1 = _kjCondition._24_8_;
        _kjCondition_1.result = _kjCondition.result;
        _kjCondition_1._25_7_ = _kjCondition._25_7_;
        _kjCondition._24_8_ = _kjCondition._24_8_ + 8;
        local_c0 = WirePointer::kind((WirePointer *)uVar1);
        local_bc = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
        f_1.exception._4_4_ = 0;
        kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                  ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   local_b8,&local_bc,(Kind *)((long)&f_1.exception + 4));
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
        if (!bVar3) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                    ((Fault *)&elementStep,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0xe7f,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      local_b8,
                     (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
          this_local._7_1_ = 0;
          kj::_::Debug::Fault::~Fault((Fault *)&elementStep);
          uVar16 = extraout_var_01;
          goto LAB_001f2c95;
        }
        data = DirectWireValue<unsigned_short>::get
                         ((DirectWireValue<unsigned_short> *)(_kjCondition_1._24_8_ + 4));
        pointers = DirectWireValue<unsigned_short>::get
                             ((DirectWireValue<unsigned_short> *)(_kjCondition_1._24_8_ + 6));
        StructSize::StructSize((StructSize *)&oldSize,data,pointers);
        sizeWords = StructSize::total((StructSize *)&oldSize);
        local_dc = WirePointer::inlineCompositeListElementCount
                             ((WirePointer *)_kjCondition_1._24_8_);
        uVar7 = upgradeBound<unsigned_long,unsigned_int>(ref._4_4_);
        uVar7 = assertMaxBits<29u,unsigned_long,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__2>
                          (uVar7 * sizeWords,&local_e1);
        oldSizeWords = (SegmentWordCount)uVar7;
        uVar7 = upgradeBound<unsigned_long,unsigned_int>(local_dc);
        uVar7 = assertMaxBits<29u,unsigned_long,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__3>
                          (uVar7 * sizeWords,(anon_class_1_0_00000001 *)((long)&newEndWord + 7));
        local_e8 = (undefined4)uVar7;
        oldEndWord = (word *)(_kjCondition._24_8_ + (ulong)oldSizeWords * 8);
        pwVar8 = (word *)(_kjCondition._24_8_ + (ulong)WVar4 * 8);
        if (local_dc < ref._4_4_) {
          if (pwVar8 < oldEndWord) {
            bVar3 = SegmentBuilder::tryExtend((SegmentBuilder *)target,pwVar8,oldEndWord);
            if (bVar3) {
              WirePointer::ListRef::setInlineComposite
                        ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),oldSizeWords);
              WirePointer::setKindAndInlineCompositeListElementCount
                        ((WirePointer *)_kjCondition_1._24_8_,STRUCT,ref._4_4_);
              uVar16 = extraout_var_04;
            }
            else {
              pBVar11 = SegmentBuilder::getArena((SegmentBuilder *)target);
              newList.structPointerCount = (ushort)oldSize;
              newList.elementSize = oldSize._2_1_;
              newList._39_1_ = oldSize._3_1_;
              initStructList((OrphanBuilder *)local_180,pBVar11,this->capTable,ref._4_4_,
                             (StructSize)oldSize);
              asStructList((ListBuilder *)local_1b0,(OrphanBuilder *)local_180,(StructSize)oldSize);
              ___end6 = kj::zeroTo<unsigned_int>(local_dc);
              i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6);
              local_1d0 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6);
              while (bVar3 = kj::Range<unsigned_int>::Iterator::operator==
                                       ((Iterator *)&i_1,&local_1d0), ((bVar3 ^ 0xffU) & 1) != 0) {
                puVar9 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
                uVar1 = _kjCondition._24_8_;
                element._4_4_ = *puVar9;
                uVar7 = upgradeBound<unsigned_long,unsigned_int>(element._4_4_);
                uVar7 = assumeBits<29u,unsigned_long>(uVar7 * sizeWords);
                local_1e0 = (void *)(uVar1 + uVar7 * 8);
                ListBuilder::getStructElement(&local_208,(ListBuilder *)local_1b0,element._4_4_);
                StructBuilder::StructBuilder
                          ((StructBuilder *)&oldSize_1,(SegmentBuilder *)target,this->capTable,
                           local_1e0,(WirePointer *)((long)local_1e0 + (ulong)(ushort)oldSize * 8),
                           (oldSize & 0xffff) << 6,oldSize._2_2_);
                other_00.capTable = pCStack_228;
                other_00.segment = _oldSize_1;
                other_00.data = local_220;
                other_00.pointers = pWStack_218;
                other_00.dataSize = local_210;
                other_00.pointerCount = SStack_20c;
                other_00._38_2_ = uStack_20a;
                StructBuilder::transferContentFrom(&local_208,other_00);
                kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
              }
              pOVar12 = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)local_180);
              operator=(this,pOVar12);
              ~OrphanBuilder((OrphanBuilder *)local_180);
              uVar16 = extraout_var_05;
            }
          }
          else {
            _kjCondition_2._32_8_ = _kjCondition._24_8_ + (uVar7 & 0xffffffff) * 8;
            f_2.exception =
                 (Exception *)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&oldEndWord);
            kj::_::DebugExpression<capnp::word*&>::operator>=
                      ((DebugComparison<capnp::word_*&,_capnp::word_*&> *)local_150,
                       (DebugExpression<capnp::word*&> *)&f_2,(word **)&_kjCondition_2.result);
            bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
            uVar1 = _kjCondition_2._32_8_;
            if (!bVar3) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word*&,capnp::word*&>&>
                        ((Fault *)&replacement.location,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0xea1,FAILED,"newEndWord >= expectedEnd","_kjCondition,",
                         (DebugComparison<capnp::word_*&,_capnp::word_*&> *)local_150);
              kj::_::Debug::Fault::fatal((Fault *)&replacement.location);
            }
            pVar10 = intervalLength<capnp::word>
                               ((word *)_kjCondition_2._32_8_,oldEndWord,0x1fffffff);
            WireHelpers::zeroMemory((word *)uVar1,(WordCountN<29>)pVar10);
            WirePointer::setKindAndInlineCompositeListElementCount
                      ((WirePointer *)_kjCondition_1._24_8_,STRUCT,ref._4_4_);
            uVar16 = extraout_var_03;
          }
        }
        else {
          ___end4 = kj::range<unsigned_int>(ref._4_4_,local_dc);
          i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4);
          local_118 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4);
          while (bVar3 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_118),
                ((bVar3 ^ 0xffU) & 1) != 0) {
            puVar9 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
            pwVar13 = target;
            uVar2 = _kjCondition._24_8_;
            uVar1 = _kjCondition_1._24_8_;
            capTable = this->capTable;
            uVar7 = upgradeBound<unsigned_long,unsigned_int>(*puVar9);
            uVar7 = assumeBits<29u,unsigned_long>(uVar7 * sizeWords);
            WireHelpers::zeroObject
                      ((SegmentBuilder *)pwVar13,capTable,(WirePointer *)uVar1,
                       (word *)(uVar2 + uVar7 * 8));
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
          }
          WirePointer::ListRef::setInlineComposite
                    ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),oldSizeWords);
          WirePointer::setKindAndInlineCompositeListElementCount
                    ((WirePointer *)_kjCondition_1._24_8_,STRUCT,ref._4_4_);
          SegmentBuilder::tryTruncate((SegmentBuilder *)target,pwVar8,oldEndWord);
          uVar16 = extraout_var_02;
        }
      }
      else if (size_00 == POINTER) {
        EVar5 = WirePointer::ListRef::elementCount
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        pwVar8 = (word *)(_kjCondition._24_8_ + (ulong)ref._4_4_ * 8);
        pwVar13 = (word *)(_kjCondition._24_8_ + (ulong)EVar5 * 8);
        replacement_1.location = pwVar8;
        if (EVar5 < ref._4_4_) {
          bVar3 = SegmentBuilder::tryExtend((SegmentBuilder *)target,pwVar13,pwVar8);
          if (bVar3) {
            WirePointer::ListRef::set
                      ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),POINTER,
                       ref._4_4_);
            uVar16 = extraout_var_07;
          }
          else {
            pBVar11 = SegmentBuilder::getArena((SegmentBuilder *)target);
            initList((OrphanBuilder *)&newList_1.structDataSize,pBVar11,this->capTable,ref._4_4_,
                     POINTER);
            asList((ListBuilder *)&oldPointers,(OrphanBuilder *)&newList_1.structDataSize,POINTER);
            uVar1 = _kjCondition._24_8_;
            ___end6_1 = kj::zeroTo<unsigned_int>(EVar5);
            i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6_1);
            local_2b8 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6_1);
            while (bVar3 = kj::Range<unsigned_int>::Iterator::operator==
                                     ((Iterator *)&i_2,&local_2b8), ((bVar3 ^ 0xffU) & 1) != 0) {
              puVar9 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
              local_2bc = *puVar9;
              ListBuilder::getPointerElement(&local_2d8,(ListBuilder *)&oldPointers,local_2bc);
              PointerBuilder::PointerBuilder
                        ((PointerBuilder *)&step,(SegmentBuilder *)target,this->capTable,
                         (WirePointer *)(uVar1 + (ulong)local_2bc * 8));
              other.capTable = pCStack_2e8;
              other.segment = _step;
              other.pointer = local_2e0;
              PointerBuilder::transferFrom(&local_2d8,other);
              kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
            }
            pOVar12 = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)&newList_1.structDataSize);
            operator=(this,pOVar12);
            ~OrphanBuilder((OrphanBuilder *)&newList_1.structDataSize);
            uVar16 = extraout_var_08;
          }
        }
        else {
          for (; replacement_1.location < pwVar13;
              replacement_1.location = replacement_1.location + 1) {
            WireHelpers::zeroPointerAndFars
                      ((SegmentBuilder *)target,(WirePointer *)replacement_1.location);
          }
          WirePointer::ListRef::set
                    ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),POINTER,ref._4_4_)
          ;
          SegmentBuilder::tryTruncate((SegmentBuilder *)target,pwVar13,pwVar8);
          uVar16 = extraout_var_06;
        }
      }
      else {
        EVar5 = WirePointer::ListRef::elementCount
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        BVar6 = dataBitsPerElement(size_00);
        uVar1 = _kjCondition._24_8_;
        uVar7 = upgradeBound<unsigned_long,unsigned_int>(ref._4_4_);
        WVar14 = WireHelpers::roundBitsUpToWords(uVar7 * BVar6);
        uVar2 = _kjCondition._24_8_;
        pwVar8 = (word *)(uVar1 + WVar14 * 8);
        uVar7 = upgradeBound<unsigned_long,unsigned_int>(EVar5);
        WVar14 = WireHelpers::roundBitsUpToWords(uVar7 * BVar6);
        uVar1 = _kjCondition._24_8_;
        pwVar13 = (word *)(uVar2 + WVar14 * 8);
        if (EVar5 < ref._4_4_) {
          bVar3 = SegmentBuilder::tryExtend((SegmentBuilder *)target,pwVar13,pwVar8);
          if (bVar3) {
            WirePointer::ListRef::set
                      ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),size_00,
                       ref._4_4_);
            uVar16 = extraout_var_10;
          }
          else {
            pBVar11 = SegmentBuilder::getArena((SegmentBuilder *)target);
            initList((OrphanBuilder *)&newList_2.structDataSize,pBVar11,this->capTable,ref._4_4_,
                     size_00);
            asList((ListBuilder *)&words,(OrphanBuilder *)&newList_2.structDataSize,size_00);
            BVar6 = dataBitsPerElement(size_00);
            uVar7 = upgradeBound<unsigned_long,unsigned_int>(EVar5);
            WVar14 = WireHelpers::roundBitsUpToWords(BVar6 * uVar7);
            local_378 = (WordCountN<29>)WVar14;
            WireHelpers::copyMemory
                      ((word *)newList_2.capTable,(word *)_kjCondition._24_8_,local_378);
            pOVar12 = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)&newList_2.structDataSize);
            operator=(this,pOVar12);
            ~OrphanBuilder((OrphanBuilder *)&newList_2.structDataSize);
            uVar16 = extraout_var_11;
          }
        }
        else {
          uVar7 = upgradeBound<unsigned_long,unsigned_int>(ref._4_4_);
          BVar15 = WireHelpers::roundBitsUpToBytes(uVar7 * BVar6);
          a = (uchar *)((uVar1 + BVar15) - (long)(int)(uint)(local_1d & 1));
          pVar10 = intervalLength<unsigned_char>(a,(uchar *)pwVar13,0xfffffff8);
          WireHelpers::zeroMemory(a,(ByteCount32)pVar10);
          WirePointer::ListRef::set
                    ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),size_00,ref._4_4_)
          ;
          SegmentBuilder::tryTruncate((SegmentBuilder *)target,pwVar13,pwVar8);
          uVar16 = extraout_var_09;
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[42]>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xe6d,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Can\'t truncate non-list.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_60,(char (*) [42])"Schema mismatch: Can\'t truncate non-list.");
      this_local._7_1_ = 0;
      kj::_::Debug::Fault::~Fault(&local_78);
      uVar16 = extraout_var_00;
    }
  }
LAB_001f2c95:
  return (uint)CONCAT71(uVar16,this_local._7_1_) & 0xffffff01;
}

Assistant:

bool OrphanBuilder::truncate(ElementCount uncheckedSize, bool isText) {
  ListElementCount size = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(uncheckedSize,
      []() { KJ_FAIL_REQUIRE("requested list size is too large"); });

  WirePointer* ref = tagAsPtr();
  SegmentBuilder* segment = this->segment;

  word* target = WireHelpers::followFars(ref, location, segment);

  if (ref->isNull()) {
    // We don't know the right element size, so we can't resize this list.
    return size == ZERO * ELEMENTS;
  }

  KJ_REQUIRE(ref->kind() == WirePointer::LIST, "Schema mismatch: Can't truncate non-list.") {
    return false;
  }

  if (isText) {
    // Add space for the NUL terminator.
    size = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(size + ONE * ELEMENTS,
        []() { KJ_FAIL_REQUIRE("requested list size is too large"); });
  }

  auto elementSize = ref->listRef.elementSize();

  if (elementSize == ElementSize::INLINE_COMPOSITE) {
    auto oldWordCount = ref->listRef.inlineCompositeWordCount();

    WirePointer* tag = reinterpret_cast<WirePointer*>(target);
    ++target;
    KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
               "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
      return false;
    }
    StructSize structSize(tag->structRef.dataSize.get(), tag->structRef.ptrCount.get());
    auto elementStep = structSize.total() / ELEMENTS;

    auto oldSize = tag->inlineCompositeListElementCount();

    SegmentWordCount sizeWords = assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
        upgradeBound<uint64_t>(size) * elementStep,
        []() { KJ_FAIL_ASSERT("requested list size too large to fit in message segment"); });
    SegmentWordCount oldSizeWords = assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
        upgradeBound<uint64_t>(oldSize) * elementStep,
        []() { KJ_FAIL_ASSERT("prior to truncate, list is larger than max segment size?"); });

    word* newEndWord = target + sizeWords;
    word* oldEndWord = target + oldWordCount;

    if (size <= oldSize) {
      // Zero the trailing elements.
      for (auto i: kj::range(size, oldSize)) {
        // assumeBits() safe because we checked that both sizeWords and oldSizeWords are in-range
        // above.
        WireHelpers::zeroObject(segment, capTable, tag, target +
            assumeBits<SEGMENT_WORD_COUNT_BITS>(upgradeBound<uint64_t>(i) * elementStep));
      }
      ref->listRef.setInlineComposite(sizeWords);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else if (newEndWord <= oldEndWord) {
      // Apparently the old list was over-allocated? The word count is more than needed to store
      // the elements. This is "valid" but shouldn't happen in practice unless someone is toying
      // with us.
      word* expectedEnd = target + oldSizeWords;
      KJ_ASSERT(newEndWord >= expectedEnd);
      WireHelpers::zeroMemory(expectedEnd,
          intervalLength(expectedEnd, newEndWord, MAX_SEGMENT_WORDS));
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
    } else {
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the new memory is already zero'd.
        ref->listRef.setInlineComposite(sizeWords);
        tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initStructList(segment->getArena(), capTable, size, structSize);

        ListBuilder newList = replacement.asStructList(structSize);
        for (auto i: kj::zeroTo(oldSize)) {
          // assumeBits() safe because we checked that both sizeWords and oldSizeWords are in-range
          // above.
          word* element = target +
              assumeBits<SEGMENT_WORD_COUNT_BITS>(upgradeBound<uint64_t>(i) * elementStep);
          newList.getStructElement(i).transferContentFrom(
              StructBuilder(segment, capTable, element,
                            reinterpret_cast<WirePointer*>(element + structSize.data),
                            structSize.data * BITS_PER_WORD, structSize.pointers));
        }

        *this = kj::mv(replacement);
      }
    }
  } else if (elementSize == ElementSize::POINTER) {
    // TODO(cleanup): GCC won't let me declare this constexpr, claiming POINTERS is not constexpr,
    //   but it is?
    const auto POINTERS_PER_ELEMENT = ONE * POINTERS / ELEMENTS;

    auto oldSize = ref->listRef.elementCount();
    word* newEndWord = target + size * POINTERS_PER_ELEMENT * WORDS_PER_POINTER;
    word* oldEndWord = target + oldSize * POINTERS_PER_ELEMENT * WORDS_PER_POINTER;

    if (size <= oldSize) {
      // Zero the trailing elements.
      for (WirePointer* element = reinterpret_cast<WirePointer*>(newEndWord);
           element < reinterpret_cast<WirePointer*>(oldEndWord); ++element) {
        WireHelpers::zeroPointerAndFars(segment, element);
      }
      ref->listRef.set(ElementSize::POINTER, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else {
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the new memory is already zero'd.
        ref->listRef.set(ElementSize::POINTER, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initList(
            segment->getArena(), capTable, size, ElementSize::POINTER);
        ListBuilder newList = replacement.asList(ElementSize::POINTER);
        WirePointer* oldPointers = reinterpret_cast<WirePointer*>(target);
        for (auto i: kj::zeroTo(oldSize)) {
          newList.getPointerElement(i).transferFrom(
              PointerBuilder(segment, capTable, oldPointers + i * POINTERS_PER_ELEMENT));
        }
        *this = kj::mv(replacement);
      }
    }
  } else {
    auto oldSize = ref->listRef.elementCount();
    auto step = dataBitsPerElement(elementSize);
    const auto MAX_STEP_BYTES = ONE * WORDS / ELEMENTS * BYTES_PER_WORD;
    word* newEndWord = target + WireHelpers::roundBitsUpToWords(
        upgradeBound<uint64_t>(size) * step);
    word* oldEndWord = target + WireHelpers::roundBitsUpToWords(
        upgradeBound<uint64_t>(oldSize) * step);

    if (size <= oldSize) {
      // When truncating text, we want to set the null terminator as well, so we'll do our zeroing
      // at the byte level.
      byte* begin = reinterpret_cast<byte*>(target);
      byte* newEndByte = begin + WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(size) * step) - isText;
      byte* oldEndByte = reinterpret_cast<byte*>(oldEndWord);

      WireHelpers::zeroMemory(newEndByte,
          intervalLength(newEndByte, oldEndByte, MAX_LIST_ELEMENTS * MAX_STEP_BYTES));
      ref->listRef.set(elementSize, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else {
      // We're trying to extend, not truncate.
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the memory is already zero'd.
        ref->listRef.set(elementSize, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initList(segment->getArena(), capTable, size, elementSize);
        ListBuilder newList = replacement.asList(elementSize);
        auto words = WireHelpers::roundBitsUpToWords(
            dataBitsPerElement(elementSize) * upgradeBound<uint64_t>(oldSize));
        WireHelpers::copyMemory(reinterpret_cast<word*>(newList.ptr), target, words);
        *this = kj::mv(replacement);
      }
    }
  }

  return true;
}